

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main.cpp
# Opt level: O0

void ChangeGroupsForLabEmployees(void)

{
  bool bVar1;
  char *pcVar2;
  int *newGroups;
  ostream *poVar3;
  int local_7c;
  int i_1;
  int *groups;
  undefined4 local_68;
  int num_groups;
  Person *pPStack_60;
  int i;
  lab_employees *le;
  bool tor;
  string local_48 [8];
  string surname;
  string local_28 [8];
  string name;
  
  std::__cxx11::string::string(local_28);
  std::__cxx11::string::string(local_48);
  std::operator<<((ostream *)&std::cout,"Name : \n");
  std::operator>>((istream *)&std::cin,local_28);
  std::operator<<((ostream *)&std::cout,"Surname : \n");
  std::operator>>((istream *)&std::cin,local_48);
  le._3_1_ = 1;
  pPStack_60 = (Person *)0x0;
  num_groups = 0;
  do {
    if (Admin::Innopolis->persons_len <= num_groups) {
LAB_00103f95:
      if ((le._3_1_ & 1) == 0) {
        std::operator<<((ostream *)&std::cout,"Number of groups : \n");
        std::istream::operator>>((istream *)&std::cin,(int *)((long)&groups + 4));
        newGroups = (int *)malloc((long)groups._4_4_ << 2);
        for (local_7c = 0; local_7c < groups._4_4_; local_7c = local_7c + 1) {
          poVar3 = std::operator<<((ostream *)&std::cout,"Write group number (");
          poVar3 = (ostream *)std::ostream::operator<<(poVar3,local_7c + 1);
          std::operator<<(poVar3,"): \n");
          std::istream::operator>>((istream *)&std::cin,newGroups + local_7c);
        }
        lab_employees::setGroups((lab_employees *)pPStack_60,newGroups,groups._4_4_);
        local_68 = 0;
      }
      else {
        std::operator<<((ostream *)&std::cout,"Not in system\n");
        local_68 = 1;
      }
      std::__cxx11::string::~string(local_48);
      std::__cxx11::string::~string(local_28);
      return;
    }
    pcVar2 = Person::getName(Admin::Innopolis->persons + num_groups);
    bVar1 = std::operator==(pcVar2,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                    *)local_28);
    if (bVar1) {
      pcVar2 = Person::getSurname(Admin::Innopolis->persons + num_groups);
      bVar1 = std::operator==(pcVar2,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                      *)local_48);
      if (bVar1) {
        le._3_1_ = 0;
        pPStack_60 = Admin::Innopolis->persons + num_groups;
        goto LAB_00103f95;
      }
    }
    num_groups = num_groups + 1;
  } while( true );
}

Assistant:

void ChangeGroupsForLabEmployees(){
    string name,surname;
    cout<<"Name : \n";
    cin>>name;
    cout<<"Surname : \n";
    cin>>surname;
    bool tor = true;
    lab_employees* le = nullptr;
    for(int i=0;i<Admin::Innopolis->persons_len;i++){
        if(Admin::Innopolis->persons[i].getName() == name
           && Admin::Innopolis->persons[i].getSurname() == surname) {

            tor = false;
            le = (lab_employees *)&(Admin::Innopolis->persons[i]);
            break;
        }
    }
    if(tor){
        cout<<"Not in system\n";
        return;
    }
    int num_groups;
    cout<<"Number of groups : \n";
    cin>>num_groups;
    int* groups = (int*)malloc(num_groups*sizeof(int));
    for(int i=0;i<num_groups;i++){
        cout<<"Write group number ("<<i+1<<"): \n";
        cin>>groups[i];
    }
    le->setGroups(groups, num_groups);
}